

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

Transform * pbrt::Scale(Float x,Float y,Float z)

{
  Transform *in_RDI;
  int in_XMM1_Da;
  int unaff_retaddr;
  int in_stack_00000008;
  SquareMatrix<4> minv;
  SquareMatrix<4> m;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff2c;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff34;
  float in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  Float in_stack_ffffffffffffff8c;
  SquareMatrix<4> *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff0;
  
  SquareMatrix<4>::SquareMatrix<int,int,int,int,float,int,int,int,int,float,int,int,int,int,int>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffffe8,in_stack_fffffffffffffff0,in_XMM1_Da,unaff_retaddr,
             in_stack_00000008);
  uVar1 = 0;
  uVar2 = 0;
  uVar3 = 0;
  SquareMatrix<4>::SquareMatrix<int,int,int,int,float,int,int,int,int,float,int,int,int,int,int>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffffe8,in_stack_fffffffffffffff0,in_XMM1_Da,unaff_retaddr,
             in_stack_00000008);
  Transform::Transform
            ((Transform *)CONCAT44(in_stack_ffffffffffffff34,uVar3),
             (SquareMatrix<4> *)CONCAT44(in_stack_ffffffffffffff2c,uVar2),
             (SquareMatrix<4> *)CONCAT44(in_stack_ffffffffffffff24,uVar1));
  return in_RDI;
}

Assistant:

Transform Scale(Float x, Float y, Float z) {
    SquareMatrix<4> m(x, 0, 0, 0,
                      0, y, 0, 0,
                      0, 0, z, 0,
                      0, 0, 0, 1);
    SquareMatrix<4> minv(1 / x,     0,     0, 0,
                             0, 1 / y,     0, 0,
                             0,     0, 1 / z, 0,
                             0,     0,     0, 1);
    return Transform(m, minv);
}